

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int fast_expansion_sum(int elen,double *e,int flen,double *f,double *h)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar10 = *e;
  dVar9 = *f;
  bVar7 = dVar10 < dVar9 == dVar9 <= -dVar10;
  if (bVar7) {
    dVar8 = f[1];
  }
  else {
    dVar8 = dVar9;
    dVar9 = dVar10;
    dVar10 = e[1];
  }
  uVar5 = (ulong)!bVar7;
  uVar3 = (ulong)bVar7;
  uVar4 = (uint)!bVar7;
  uVar2 = (uint)bVar7;
  if ((int)uVar2 < flen && (int)uVar4 < elen) {
    if (dVar10 < dVar8 == dVar8 <= -dVar10) {
      dVar11 = dVar9 + dVar8;
      *h = dVar9 - (dVar11 - dVar8);
      uVar3 = (ulong)(uVar2 + 1);
      dVar8 = f[uVar3];
      dVar9 = dVar11;
    }
    else {
      dVar11 = dVar9 + dVar10;
      *h = dVar9 - (dVar11 - dVar10);
      uVar5 = (ulong)(uVar4 + 1);
      dVar10 = e[uVar5];
      dVar9 = dVar11;
    }
    uVar1 = 1;
    while( true ) {
      uVar2 = (uint)uVar3;
      uVar4 = (uint)uVar5;
      if ((elen <= (int)uVar4) || (flen <= (int)uVar2)) break;
      if (dVar10 < dVar8 == dVar8 <= -dVar10) {
        dVar11 = dVar9 + dVar8;
        h[uVar1] = (dVar9 - (dVar11 - (dVar11 - dVar9))) + (dVar8 - (dVar11 - dVar9));
        uVar3 = (ulong)(uVar2 + 1);
        dVar8 = f[(long)(int)uVar2 + 1];
        dVar9 = dVar11;
      }
      else {
        dVar11 = dVar9 + dVar10;
        h[uVar1] = (dVar9 - (dVar11 - (dVar11 - dVar9))) + (dVar10 - (dVar11 - dVar9));
        uVar5 = (ulong)(uVar4 + 1);
        dVar10 = e[(long)(int)uVar4 + 1];
        dVar9 = dVar11;
      }
      uVar1 = uVar1 + 1;
    }
    uVar1 = uVar1 & 0xffffffff;
  }
  else {
    uVar1 = 0;
  }
  for (lVar6 = (long)(int)uVar4; lVar6 < elen; lVar6 = lVar6 + 1) {
    dVar11 = dVar9 + dVar10;
    h[uVar1] = (dVar9 - (dVar11 - (dVar11 - dVar9))) + (dVar10 - (dVar11 - dVar9));
    dVar10 = e[lVar6 + 1];
    uVar1 = uVar1 + 1;
    dVar9 = dVar11;
  }
  for (lVar6 = (long)(int)uVar2; lVar6 < flen; lVar6 = lVar6 + 1) {
    dVar10 = dVar9 + dVar8;
    h[uVar1] = (dVar9 - (dVar10 - (dVar10 - dVar9))) + (dVar8 - (dVar10 - dVar9));
    dVar8 = f[lVar6 + 1];
    uVar1 = uVar1 + 1;
    dVar9 = dVar10;
  }
  h[uVar1 & 0xffffffff] = dVar9;
  return (int)uVar1 + 1;
}

Assistant:

int fast_expansion_sum(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* h cannot be e or f. */
{
  REAL Q;
  INEXACT REAL Qnew;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  REAL enow, fnow;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    Q = enow;
    enow = e[++eindex];
  } else {
    Q = fnow;
    fnow = f[++findex];
  }
  hindex = 0;
  if ((eindex < elen) && (findex < flen)) {
    if ((fnow > enow) == (fnow > -enow)) {
      Fast_Two_Sum(enow, Q, Qnew, h[0]);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, Q, Qnew, h[0]);
      fnow = f[++findex];
    }
    Q = Qnew;
    hindex = 1;
    while ((eindex < elen) && (findex < flen)) {
      if ((fnow > enow) == (fnow > -enow)) {
        Two_Sum(Q, enow, Qnew, h[hindex]);
        enow = e[++eindex];
      } else {
        Two_Sum(Q, fnow, Qnew, h[hindex]);
        fnow = f[++findex];
      }
      Q = Qnew;
      hindex++;
    }
  }
  while (eindex < elen) {
    Two_Sum(Q, enow, Qnew, h[hindex]);
    enow = e[++eindex];
    Q = Qnew;
    hindex++;
  }
  while (findex < flen) {
    Two_Sum(Q, fnow, Qnew, h[hindex]);
    fnow = f[++findex];
    Q = Qnew;
    hindex++;
  }
  h[hindex] = Q;
  return hindex + 1;
}